

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void * get_proc(char *namez)

{
  char *local_20;
  void *result;
  char *namez_local;
  
  local_20 = (char *)0x0;
  if (libGL == (void *)0x0) {
    namez_local = (char *)0x0;
  }
  else {
    if (gladGetProcAddressPtr != (PFNGLXGETPROCADDRESSPROC_PRIVATE)0x0) {
      local_20 = (char *)(*gladGetProcAddressPtr)(namez);
    }
    if (local_20 == (char *)0x0) {
      local_20 = (char *)dlsym(libGL,namez);
    }
    namez_local = local_20;
  }
  return namez_local;
}

Assistant:

static
void* get_proc(const char *namez) {
    void* result = NULL;
    if(libGL == NULL) return NULL;

#ifndef __APPLE__
    if(gladGetProcAddressPtr != NULL) {
        result = gladGetProcAddressPtr(namez);
    }
#endif
    if(result == NULL) {
#ifdef _WIN32
        result = (void*)GetProcAddress(libGL, namez);
#else
        result = dlsym(libGL, namez);
#endif
    }

    return result;
}